

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::
ParseFrom<(google::protobuf::MessageLite::ParseFlags)1,std::__cxx11::string>
          (MessageLite *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input)

{
  internal *this_00;
  char *size;
  bool bVar1;
  ParseFlags in_R8D;
  StringPiece input_00;
  
  (*this->_vptr_MessageLite[4])();
  this_00 = (internal *)(input->_M_dataplus)._M_p;
  size = (char *)input->_M_string_length;
  if ((long)size < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              ((size_t)size,"string length exceeds max size");
  }
  input_00.length_ = (size_type)this;
  input_00.ptr_ = size;
  bVar1 = internal::MergeFromImpl<false>(this_00,input_00,(MessageLite *)0x1,in_R8D);
  return bVar1;
}

Assistant:

bool MessageLite::ParseFrom(const T& input) {
  if (flags & kParse) Clear();
  constexpr bool alias = (flags & kMergeWithAliasing) != 0;
  return internal::MergeFromImpl<alias>(input, this, flags);
}